

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rl_pacman_agent.hh
# Opt level: O2

void __thiscall RL_Pacman_Agent::RL_Pacman_Agent(RL_Pacman_Agent *this)

{
  allocator_type local_51;
  value_type_conflict2 local_50;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  (this->super_Agent)._vptr_Agent = (_func_int **)&PTR_take_action_0011fca8;
  this->reward = 0.0;
  (this->previous_input).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->previous_input).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->previous_input).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->input).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->input).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->input).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->max_input).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->max_input).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->max_input).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->n_games = 1;
  Neural_Network::Neural_Network
            (&this->nn,RL_Pacman_Agent_Inputs::n_inputs,Arguments::n_hidden_layers,
             Arguments::n_hidden_neurons,1,Arguments::learning_rate,Arguments::activation_function);
  local_50 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_48,
             (long)RL_Pacman_Agent_Inputs::n_inputs,&local_50,&local_51);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&this->previous_input,&local_48);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_48,
             (long)RL_Pacman_Agent_Inputs::n_inputs,(allocator_type *)&local_50);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&this->max_input,&local_48);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_48,
             (long)RL_Pacman_Agent_Inputs::n_inputs,(allocator_type *)&local_50);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&this->input,&local_48);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  this->mse_sum = 0.0;
  this->mse_sum_last = 0.0;
  return;
}

Assistant:

RL_Pacman_Agent() : reward(0), n_games(1),
                        nn(RL_Pacman_Agent_Inputs::n_inputs, Arguments::n_hidden_layers, Arguments::n_hidden_neurons, 1, Arguments::learning_rate, Arguments::activation_function)
    {
        previous_input = vector<double>(RL_Pacman_Agent_Inputs::n_inputs, 0.0);
        max_input = vector<double>(RL_Pacman_Agent_Inputs::n_inputs);
        input = vector<double>(RL_Pacman_Agent_Inputs::n_inputs);
        mse_sum_last = mse_sum = 0.0;
    }